

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationsInfo.cpp
# Opt level: O0

void __thiscall ezc3d::DataNS::RotationNS::Info::Info(Info *this,c3d *c3d)

{
  bool bVar1;
  PROCESSOR_TYPE PVar2;
  Group *pGVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  const_reference pvVar5;
  runtime_error *prVar6;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar7;
  Header *this_01;
  Parameters *this_02;
  undefined1 *in_RDI;
  float fVar8;
  double dVar9;
  Group *group;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  Group *in_stack_fffffffffffffcc0;
  value_type vVar10;
  string *in_stack_fffffffffffffcd0;
  Group *in_stack_fffffffffffffcd8;
  Parameter *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  byte local_2aa;
  bool local_1db;
  allocator<char> local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [37];
  byte local_163;
  byte local_162;
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [32];
  Group *local_50;
  allocator<char> local_31;
  string local_30 [48];
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  ezc3d::c3d::parameters((c3d *)0x17fa4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (allocator<char> *)in_stack_fffffffffffffcf0);
  bVar1 = ParametersNS::Parameters::isGroup
                    ((Parameters *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    *in_RDI = 1;
    ezc3d::c3d::parameters((c3d *)0x17fb45);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    pGVar3 = ParametersNS::Parameters::group
                       ((Parameters *)in_stack_fffffffffffffcc0,
                        (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    local_50 = pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    bVar1 = ParametersNS::GroupNS::Group::isParameter
                      (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"DATA_START is not present in ROTATION.");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    ParametersNS::GroupNS::Group::parameter
              (in_stack_fffffffffffffcc0,
               (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsInt(in_stack_fffffffffffffcf0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    *(long *)(in_RDI + 8) = (long)*pvVar5;
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    bVar1 = ParametersNS::GroupNS::Group::isParameter
                      (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"USED is not present in ROTATION.");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    ParametersNS::GroupNS::Group::parameter
              (in_stack_fffffffffffffcc0,
               (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsInt(in_stack_fffffffffffffcf0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    *(long *)(in_RDI + 0x10) = (long)*pvVar5;
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    std::allocator<char>::allocator();
    local_162 = 0;
    local_163 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    bVar1 = ParametersNS::GroupNS::Group::isParameter
                      (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    local_2aa = 0;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_162 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      local_163 = 1;
      bVar1 = ParametersNS::GroupNS::Group::isParameter
                        (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      local_2aa = bVar1 ^ 0xff;
    }
    if ((local_163 & 1) != 0) {
      std::__cxx11::string::~string(local_160);
    }
    if ((local_162 & 1) != 0) {
      std::allocator<char>::~allocator(&local_161);
    }
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
    if ((local_2aa & 1) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"RATIO or RATE must be present in ROTATION.");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    local_1b2 = 0;
    local_1b3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (allocator<char> *)in_stack_fffffffffffffcf0);
    local_1db = ParametersNS::GroupNS::Group::isParameter
                          (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    if (local_1db) {
      std::allocator<char>::allocator();
      local_1b2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      local_1b3 = 1;
      ParametersNS::GroupNS::Group::parameter
                (in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsInt(in_stack_fffffffffffffcf0);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
      dVar9 = (double)*pvVar5;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      ParametersNS::GroupNS::Group::parameter
                (in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      this_00 = ParametersNS::GroupNS::Parameter::valuesAsDouble(in_stack_fffffffffffffcf0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      vVar10 = *pvVar7;
      this_01 = ezc3d::c3d::header((c3d *)0x1804d2);
      fVar8 = Header::frameRate(this_01);
      dVar9 = vVar10 / (double)fVar8;
    }
    local_1db = !local_1db;
    *(long *)(in_RDI + 0x18) =
         (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
    if (local_1db) {
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
    }
    if ((local_1b3 & 1) != 0) {
      std::__cxx11::string::~string(local_1b0);
    }
    if ((local_1b2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1b1);
    }
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    this_02 = ezc3d::c3d::parameters((c3d *)0x1805c8);
    PVar2 = ParametersNS::Parameters::processorType(this_02);
    *(PROCESSOR_TYPE *)(in_RDI + 0x20) = PVar2;
  }
  return;
}

Assistant:

ezc3d::DataNS::RotationNS::Info::Info(const ezc3d::c3d &c3d)
    : _hasGroup(false), _dataStart(-1), _used(0), _ratio(0) {
  if (!c3d.parameters().isGroup("ROTATION")) {
    return;
  }
  _hasGroup = true;

  const ezc3d::ParametersNS::GroupNS::Group &group =
      c3d.parameters().group("ROTATION");

  // Do a sanity check before accessing
  if (!group.isParameter("DATA_START")) {
    throw std::runtime_error("DATA_START is not present in ROTATION.");
  }
  _dataStart = group.parameter("DATA_START").valuesAsInt()[0];

  if (!group.isParameter("USED")) {
    throw std::runtime_error("USED is not present in ROTATION.");
  }
  _used = group.parameter("USED").valuesAsInt()[0];

  if (!group.isParameter("RATIO") && !group.isParameter("RATE")) {
    throw std::runtime_error("RATIO or RATE must be present in ROTATION.");
  }
  _ratio = static_cast<size_t>(
      group.isParameter("RATIO") ? group.parameter("RATIO").valuesAsInt()[0]
                                 : group.parameter("RATE").valuesAsDouble()[0] /
                                       c3d.header().frameRate());

  _processorType = c3d.parameters().processorType();
}